

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hxx
# Opt level: O3

size_t andres::graph::
       labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::validate(lineage::ProblemGraph_const&,lineage::Solution_const&)::SubgraphWithoutCut,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *graph,
                 SubgraphWithoutCut *mask,
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 labeling)

{
  ulong uVar1;
  ulong uVar2;
  pointer pRVar3;
  pointer pRVar4;
  ulong uVar5;
  pointer pAVar6;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queue;
  size_t local_d0;
  unsigned_long local_c8;
  unsigned_long *local_c0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  Value local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_b8._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_b8._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  local_c0 = labeling._M_current;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,
             (long)(graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_b8,
             (allocator_type *)&local_c8);
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_last = (ulong *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_start._M_first = (ulong *)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_b8._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_b8,0);
  local_c8 = 0;
  pRVar3 = (graph->vertices_).
           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar4 = (graph->vertices_).
           super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar4 == pRVar3) {
    local_d0 = 0;
  }
  else {
    local_d0 = 0;
    do {
      uVar5 = local_c8 + 0x3f;
      if (-1 < (long)local_c8) {
        uVar5 = local_c8;
      }
      if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [((long)uVar5 >> 6) + ((ulong)((local_c8 & 0x800000000000003f) < 0x8000000000000001) - 1)
           ] >> (local_c8 & 0x3f) & 1) == 0) {
        local_c0[local_c8] = local_d0;
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_long,std::allocator<unsigned_long>>::
          _M_push_back_aux<unsigned_long_const&>
                    ((deque<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,&local_c8);
        }
        else {
          *local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_c8;
          local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        uVar5 = local_c8 + 0x3f;
        if (-1 < (long)local_c8) {
          uVar5 = local_c8;
        }
        local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p
        [((long)uVar5 >> 6) + ((ulong)((local_c8 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
             local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [((long)uVar5 >> 6) +
              ((ulong)((local_c8 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
             1L << ((byte)local_c8 & 0x3f);
        if (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_b8._M_impl.super__Deque_impl_data._M_start._M_cur) {
          pRVar3 = (graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          do {
            uVar5 = *local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
            if (local_b8._M_impl.super__Deque_impl_data._M_start._M_cur ==
                local_b8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
              operator_delete(local_b8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
              local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_node[1];
              local_b8._M_impl.super__Deque_impl_data._M_start._M_last =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
              local_b8._M_impl.super__Deque_impl_data._M_start._M_first =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_cur;
              local_b8._M_impl.super__Deque_impl_data._M_start._M_node =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
            }
            else {
              local_b8._M_impl.super__Deque_impl_data._M_start._M_cur =
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
            }
            pRVar3 = (graph->vertices_).
                     super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pAVar6 = pRVar3[uVar5].vector_.
                     super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pAVar6 != pRVar3[uVar5].vector_.
                          super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              do {
                if ((mask->edgeLabels_->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_start[pAVar6->edge_] == '\0') {
                  uVar1 = pAVar6->vertex_;
                  uVar2 = uVar1 + 0x3f;
                  if (-1 < (long)uVar1) {
                    uVar2 = uVar1;
                  }
                  if ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [((long)uVar2 >> 6) +
                        ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
                       (uVar1 & 0x3f) & 1) == 0) {
                    local_c0[uVar1] = local_d0;
                    local_60 = pAVar6->vertex_;
                    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
                    emplace_back<unsigned_long>
                              ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,
                               &local_60);
                    uVar1 = pAVar6->vertex_;
                    uVar2 = uVar1 + 0x3f;
                    if (-1 < (long)uVar1) {
                      uVar2 = uVar1;
                    }
                    local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                    [((long)uVar2 >> 6) +
                     ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                         local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                         [((long)uVar2 >> 6) +
                          ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                         1L << ((byte)uVar1 & 0x3f);
                    pRVar3 = (graph->vertices_).
                             super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  }
                }
                pAVar6 = pAVar6 + 1;
              } while (pAVar6 != pRVar3[uVar5].vector_.
                                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
            }
          } while (local_b8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
                   local_b8._M_impl.super__Deque_impl_data._M_start._M_cur);
        }
        local_d0 = local_d0 + 1;
        pRVar4 = (graph->vertices_).
                 super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 < (ulong)((long)pRVar4 - (long)pRVar3 >> 5));
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_b8);
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return local_d0;
}

Assistant:

std::size_t
labelComponents(
    const GRAPH& graph,
    const SUBGRAPH_MASK& mask,
    ITERATOR labeling
) {
    std::size_t label = 0;
    std::vector<bool> visited(graph.numberOfVertices(), false);
    std::queue<std::size_t> queue;
    for(std::size_t v = 0; v < graph.numberOfVertices(); ++v) {
        if(mask.vertex(v)) {
            if(!visited[v]) {
                labeling[v] = label; // label
                queue.push(v);
                visited[v] = true;
                while(!queue.empty()) {
                    std::size_t w = queue.front();
                    queue.pop();
                    for(typename GRAPH::AdjacencyIterator it = graph.adjacenciesFromVertexBegin(w);
                    it != graph.adjacenciesFromVertexEnd(w); ++it) {
                        if(mask.edge(it->edge()) 
                        && mask.vertex(it->vertex()) 
                        && !visited[it->vertex()]) {
                            labeling[it->vertex()] = label; // label
                            queue.push(it->vertex());
                            visited[it->vertex()] = true;
                        }
                    }
                }
                label++;
            }
        }
        else {
            labeling[v] = 0;
        }
    }
    return label;
}